

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::FunctionalTest::draw(FunctionalTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar8 + 0xd0))(0x8e22,this->m_xfb_dsa);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glBindTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x776);
  (**(code **)(lVar8 + 0x30))(0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x779);
  (**(code **)(lVar8 + 0x5e0))(0x8c89);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glEnable(GL_RASTERIZER_DISCARD) call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x77d);
  (**(code **)(lVar8 + 0x538))(0,0,4);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x781);
  (**(code **)(lVar8 + 0xfe0))();
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glPauseTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x785);
  bVar1 = testTransformFeedbackStatus(this,0x8e23,1);
  bVar2 = testTransformFeedbackStatus(this,0x8e24,1);
  (**(code **)(lVar8 + 0x1248))();
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glPauseTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x78c);
  bVar3 = testTransformFeedbackStatus(this,0x8e23,0);
  bVar4 = testTransformFeedbackStatus(this,0x8e24,1);
  (**(code **)(lVar8 + 0x638))();
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x793);
  bVar5 = testTransformFeedbackStatus(this,0x8e24,0);
  return bVar5 && ((bVar4 && bVar3) && (bVar2 && bVar1));
}

Assistant:

bool FunctionalTest::draw()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default result. */
	bool is_ok = true;

	/* Start transform feedback environment. */
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfb_dsa);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback call failed.");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	/* Use only xfb. No rendering. */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed.");

	/* Draw. */
	gl.drawArrays(GL_POINTS, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	/* Pause Transform Feedback and tests direct state queries related to paused state. */
	gl.pauseTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPauseTransformFeedback call failed.");

	is_ok &= testTransformFeedbackStatus(GL_TRANSFORM_FEEDBACK_PAUSED, GL_TRUE);
	is_ok &= testTransformFeedbackStatus(GL_TRANSFORM_FEEDBACK_ACTIVE, GL_TRUE);

	/* Activate Transform Feedback and tests direct state queries related to paused state. */
	gl.resumeTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPauseTransformFeedback call failed.");

	is_ok &= testTransformFeedbackStatus(GL_TRANSFORM_FEEDBACK_PAUSED, GL_FALSE);
	is_ok &= testTransformFeedbackStatus(GL_TRANSFORM_FEEDBACK_ACTIVE, GL_TRUE);

	/* Finish transform feedback. */
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	is_ok &= testTransformFeedbackStatus(GL_TRANSFORM_FEEDBACK_ACTIVE, GL_FALSE);

	return is_ok;
}